

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O0

float rsg::
      UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::InvSqrtOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::InvSqrtOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::InvSqrtOp>_>
      ::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  bool bVar1;
  int iVar2;
  VariableType *pVVar3;
  ShaderParameters *pSVar4;
  int iVar5;
  float outMin;
  float outMax;
  ConstValueRangeAccess local_98;
  ConstValueAccess local_80;
  ConstValueRangeAccess local_70;
  ConstValueAccess local_58;
  GetUnaryBuiltinVecWeight<rsg::InvSqrtOp> local_45;
  float local_44;
  int local_40;
  float elemWeight;
  int elemNdx;
  float combinedWeight;
  Scalar *local_30;
  Scalar *local_28;
  int local_1c;
  GeneratorState *pGStack_18;
  int availableLevels;
  GeneratorState *state_local;
  
  pGStack_18 = state;
  pVVar3 = ConstValueRangeAccess::getType(&valueRange);
  bVar1 = VariableType::isFloatOrVec(pVVar3);
  if (bVar1) {
    pSVar4 = GeneratorState::getShaderParameters(pGStack_18);
    iVar5 = pSVar4->maxExpressionDepth;
    iVar2 = GeneratorState::getExpressionDepth(pGStack_18);
    iVar5 = iVar5 - iVar2;
    _elemNdx = valueRange.m_type;
    local_30 = valueRange.m_min;
    local_28 = valueRange.m_max;
    local_1c = iVar5;
    iVar2 = getConservativeValueExprDepth(pGStack_18,valueRange);
    if (iVar5 < iVar2 + 1) {
      state_local._4_4_ = 0.0;
    }
    else {
      elemWeight = 1.0;
      local_40 = 0;
      while( true ) {
        iVar5 = local_40;
        pVVar3 = ConstValueRangeAccess::getType(&valueRange);
        iVar2 = VariableType::getNumElements(pVVar3);
        if (iVar2 <= iVar5) break;
        ConstValueRangeAccess::component(&local_70,&valueRange,local_40);
        local_58 = ConstValueRangeAccess::getMin(&local_70);
        outMin = ConstStridedValueAccess<1>::asFloat(&local_58);
        ConstValueRangeAccess::component(&local_98,&valueRange,local_40);
        local_80 = ConstValueRangeAccess::getMax(&local_98);
        outMax = ConstStridedValueAccess<1>::asFloat(&local_80);
        local_44 = GetUnaryBuiltinVecWeight<rsg::InvSqrtOp>::operator()(&local_45,outMin,outMax);
        elemWeight = local_44 * elemWeight;
        local_40 = local_40 + 1;
      }
      state_local._4_4_ = elemWeight;
    }
  }
  else {
    state_local._4_4_ = 0.0;
  }
  return state_local._4_4_;
}

Assistant:

float UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	// \todo [2011-06-14 pyry] Void support?
	if (!valueRange.getType().isFloatOrVec())
		return 0.0f;

	int availableLevels = state.getShaderParameters().maxExpressionDepth - state.getExpressionDepth();

	if (availableLevels < getConservativeValueExprDepth(state, valueRange) + 1)
		return 0.0f;

	// Compute value range weight
	float combinedWeight = 1.0f;
	for (int elemNdx = 0; elemNdx < valueRange.getType().getNumElements(); elemNdx++)
	{
		float elemWeight = GetValueRangeWeight()(valueRange.component(elemNdx).getMin().asFloat(), valueRange.component(elemNdx).getMax().asFloat());
		combinedWeight *= elemWeight;
	}

	return combinedWeight;
}